

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

void wallet::MaybeCompactWalletDB(WalletContext *context)

{
  __int_type_conflict2 _Var1;
  atomic<bool> aVar2;
  int iVar3;
  WalletDatabase *pWVar4;
  int64_t iVar5;
  shared_ptr<wallet::CWallet> *pwallet;
  pointer psVar6;
  long in_FS_OFFSET;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  local_40;
  long local_28;
  
  aVar2._M_base._M_i = MaybeCompactWalletDB::fOneThread._M_base._M_i;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  MaybeCompactWalletDB::fOneThread._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  if (((byte)aVar2._M_base._M_i & 1) == 0) {
    GetWallets(&local_40,context);
    for (psVar6 = local_40.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar6 != local_40.
                  super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; psVar6 = psVar6 + 1) {
      pWVar4 = CWallet::GetDatabase
                         ((psVar6->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr);
      _Var1 = (pWVar4->nUpdateCounter).super___atomic_base<unsigned_int>._M_i;
      if (pWVar4->nLastSeen != _Var1) {
        pWVar4->nLastSeen = _Var1;
        iVar5 = GetTime();
        pWVar4->nLastWalletUpdate = iVar5;
      }
      if (pWVar4->nLastFlushed != _Var1) {
        iVar5 = GetTime();
        if (1 < iVar5 - pWVar4->nLastWalletUpdate) {
          iVar3 = (*pWVar4->_vptr_WalletDatabase[9])(pWVar4);
          if ((char)iVar3 != '\0') {
            pWVar4->nLastFlushed = _Var1;
          }
        }
      }
    }
    std::
    vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>::
    ~vector(&local_40);
    LOCK();
    MaybeCompactWalletDB::fOneThread._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MaybeCompactWalletDB(WalletContext& context)
{
    static std::atomic<bool> fOneThread(false);
    if (fOneThread.exchange(true)) {
        return;
    }

    for (const std::shared_ptr<CWallet>& pwallet : GetWallets(context)) {
        WalletDatabase& dbh = pwallet->GetDatabase();

        unsigned int nUpdateCounter = dbh.nUpdateCounter;

        if (dbh.nLastSeen != nUpdateCounter) {
            dbh.nLastSeen = nUpdateCounter;
            dbh.nLastWalletUpdate = GetTime();
        }

        if (dbh.nLastFlushed != nUpdateCounter && GetTime() - dbh.nLastWalletUpdate >= 2) {
            if (dbh.PeriodicFlush()) {
                dbh.nLastFlushed = nUpdateCounter;
            }
        }
    }

    fOneThread = false;
}